

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

void __thiscall
TagVisitor<ObjectSourcesTag,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
::TagVisitor(TagVisitor<ObjectSourcesTag,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
             *this,cmGeneratorTarget *target,
            vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *data)

{
  TargetType TVar1;
  cmLocalGenerator *this_00;
  cmGlobalGenerator *pcVar2;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *data_local;
  cmGeneratorTarget *target_local;
  TagVisitor<ObjectSourcesTag,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
  *this_local;
  
  this->Data = data;
  std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::vector(&this->BadObjLibFiles);
  this->Target = target;
  this_00 = cmGeneratorTarget::GetLocalGenerator(target);
  pcVar2 = cmLocalGenerator::GetGlobalGenerator(this_00);
  this->GlobalGenerator = pcVar2;
  cmsys::RegularExpression::RegularExpression
            (&this->Header,"\\.(h|hh|h\\+\\+|hm|hpp|hxx|in|txx|inl)$");
  TVar1 = cmGeneratorTarget::GetType(target);
  this->IsObjLib = TVar1 == OBJECT_LIBRARY;
  return;
}

Assistant:

TagVisitor(cmGeneratorTarget const* target, DataType& data)
    : Data(data), Target(target),
    GlobalGenerator(target->GetLocalGenerator()->GetGlobalGenerator()),
    Header(CM_HEADER_REGEX),
    IsObjLib(target->GetType() == cmState::OBJECT_LIBRARY)
  {
  }